

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteVerilog.c
# Opt level: O2

int Io_WriteVerilogWiresCount(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  long *plVar2;
  Abc_Obj_t *pAVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  
  iVar6 = pNtk->nObjCounts[8];
  for (iVar7 = 0; iVar7 < pNtk->vObjs->nSize; iVar7 = iVar7 + 1) {
    pAVar3 = Abc_NtkObj(pNtk,iVar7);
    if ((((pAVar3 != (Abc_Obj_t *)0x0) && (iVar7 != 0)) &&
        ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) &&
       ((plVar2 = (long *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray],
        *(int *)((long)plVar2 + 0x2c) < 1 ||
        ((*(uint *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8
                             ) + 0x14) & 0xf) - 5 < 0xfffffffe)))) {
      iVar6 = iVar6 + 1;
    }
  }
  for (iVar7 = 0; iVar7 < pNtk->vBoxes->nSize; iVar7 = iVar7 + 1) {
    pAVar3 = Abc_NtkBox(pNtk,iVar7);
    if ((*(uint *)&pAVar3->field_0x14 & 0xf) != 8) {
      iVar6 = iVar6 + (pAVar3->vFanins).nSize;
      uVar1 = (pAVar3->vFanouts).nSize;
      uVar4 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar4 = 0;
      }
      for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        plVar2 = (long *)pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanouts).pArray[uVar5]];
        plVar2 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8);
        if ((*(int *)((long)plVar2 + 0x2c) < 1) ||
           ((*(uint *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                (long)*(int *)plVar2[6] * 8) + 0x14) & 0xf) - 5 < 0xfffffffe)) {
          iVar6 = iVar6 + 1;
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int Io_WriteVerilogWiresCount( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pNet, * pBox;
    int i, k, nWires;
    nWires = Abc_NtkLatchNum(pNtk);
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( i == 0 ) 
            continue;
        pNet = Abc_ObjFanout0(pObj);
        if ( Abc_ObjFanoutNum(pNet) > 0 && Abc_ObjIsCo(Abc_ObjFanout0(pNet)) )
            continue;
        nWires++;
    }
    Abc_NtkForEachBox( pNtk, pBox, i )
    {
        if ( Abc_ObjIsLatch(pBox) )
            continue;
        nWires += Abc_ObjFaninNum(pBox);
        Abc_ObjForEachFanout( pBox, pObj, k )
        {
            pNet = Abc_ObjFanout0(pObj);
            if ( Abc_ObjFanoutNum(pNet) > 0 && Abc_ObjIsCo(Abc_ObjFanout0(pNet)) )
                continue;
            nWires++;
        }
    }
    return nWires;
}